

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

void G_xor(uint8_t *out,uint8_t *X,uint8_t *Y)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint local_c38;
  uint local_c34;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint64_t Z [128];
  uint64_t Q [128];
  uint64_t R [128];
  uint8_t *Y_local;
  uint8_t *X_local;
  uint8_t *out_local;
  
  for (i_2 = 0; i_2 < 0x80; i_2 = i_2 + 1) {
    uVar1 = GET_64BIT_LSB_FIRST(X + (i_2 << 3));
    uVar2 = GET_64BIT_LSB_FIRST(Y + (i_2 << 3));
    Q[(ulong)i_2 + 0x7f] = uVar1 ^ uVar2;
  }
  for (i_3 = 0; i_3 < 8; i_3 = i_3 + 1) {
    P(Z + (ulong)(i_3 << 4) + 0x7f,2,Q + (ulong)(i_3 << 4) + 0x7f,2);
  }
  for (local_c34 = 0; local_c34 < 8; local_c34 = local_c34 + 1) {
    P((uint64_t *)(&i_1 + (ulong)(local_c34 << 1) * 2),0x10,Z + (ulong)(local_c34 << 1) + 0x7f,0x10)
    ;
  }
  for (local_c38 = 0; local_c38 < 0x80; local_c38 = local_c38 + 1) {
    uVar1 = GET_64BIT_LSB_FIRST(out + (local_c38 << 3));
    PUT_64BIT_LSB_FIRST(out + (local_c38 << 3),
                        uVar1 ^ Q[(ulong)local_c38 + 0x7f] ^ *(ulong *)(&i_1 + (ulong)local_c38 * 2)
                       );
  }
  smemclr(Q + 0x7f,0x400);
  smemclr(Z + 0x7f,0x400);
  smemclr(&i_1,0x400);
  return;
}

Assistant:

static void G_xor(uint8_t *out, const uint8_t *X, const uint8_t *Y)
{
    uint64_t R[128], Q[128], Z[128];

    for (unsigned i = 0; i < 128; i++)
        R[i] = GET_64BIT_LSB_FIRST(X + 8*i) ^ GET_64BIT_LSB_FIRST(Y + 8*i);

    for (unsigned i = 0; i < 8; i++)
        P(Q+16*i, 2, R+16*i, 2);

    for (unsigned i = 0; i < 8; i++)
        P(Z+2*i, 16, Q+2*i, 16);

    for (unsigned i = 0; i < 128; i++)
        PUT_64BIT_LSB_FIRST(out + 8*i,
                            GET_64BIT_LSB_FIRST(out + 8*i) ^ R[i] ^ Z[i]);

    smemclr(R, sizeof(R));
    smemclr(Q, sizeof(Q));
    smemclr(Z, sizeof(Z));
}